

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ForLoopStatement * __thiscall
slang::BumpAllocator::
emplace<slang::ast::ForLoopStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
          (BumpAllocator *this,span<const_slang::ast::Expression_*,_18446744073709551615UL> *args,
          Expression **args_1,span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_2,
          Statement *args_3,SourceRange *args_4)

{
  Expression *pEVar1;
  pointer ppEVar2;
  size_t sVar3;
  pointer ppEVar4;
  size_t sVar5;
  SourceLocation SVar6;
  SourceLocation SVar7;
  ForLoopStatement *pFVar8;
  
  pFVar8 = (ForLoopStatement *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ForLoopStatement *)this->endPtr < pFVar8 + 1) {
    pFVar8 = (ForLoopStatement *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pFVar8 + 1);
  }
  ppEVar2 = args->_M_ptr;
  sVar3 = (args->_M_extent)._M_extent_value;
  pEVar1 = *args_1;
  ppEVar4 = args_2->_M_ptr;
  sVar5 = (args_2->_M_extent)._M_extent_value;
  SVar6 = args_4->startLoc;
  SVar7 = args_4->endLoc;
  (pFVar8->super_Statement).kind = ForLoop;
  (pFVar8->super_Statement).syntax = (StatementSyntax *)0x0;
  (pFVar8->super_Statement).sourceRange.startLoc = SVar6;
  (pFVar8->super_Statement).sourceRange.endLoc = SVar7;
  (pFVar8->initializers)._M_ptr = ppEVar2;
  (pFVar8->initializers)._M_extent._M_extent_value = sVar3;
  (pFVar8->loopVars)._M_ptr = (pointer)0x0;
  (pFVar8->loopVars)._M_extent._M_extent_value = 0;
  pFVar8->stopExpr = pEVar1;
  (pFVar8->steps)._M_ptr = ppEVar4;
  (pFVar8->steps)._M_extent._M_extent_value = sVar5;
  pFVar8->body = args_3;
  return pFVar8;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }